

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_vector_test.cpp
# Opt level: O1

void __thiscall
adt_vector_test_DefaultConstructor_Test::TestBody(adt_vector_test_DefaultConstructor_Test *this)

{
  undefined8 uVar1;
  undefined8 *puVar2;
  char *pcVar3;
  AssertHelperData *pAVar4;
  AssertionResult gtest_ar;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_50;
  AssertHelper local_48;
  ulong local_40;
  undefined8 *local_38;
  
  uVar1 = vector_create_reserve(8,0x32);
  local_50._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       vector_type_size(uVar1);
  local_48.data_ = (AssertHelperData *)0x8;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_40,"(size_t)vector_type_size(v)","(size_t)sizeof(size_t)",
             (unsigned_long *)&local_50,(unsigned_long *)&local_48);
  puVar2 = local_38;
  if (local_40._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_38 == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (char *)*local_38;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_vector_test/source/adt_vector_test.cpp"
               ,0x24,pcVar3);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
  }
  else {
    if (local_38 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_38 != local_38 + 2) {
        operator_delete((undefined8 *)*local_38);
      }
      operator_delete(puVar2);
    }
    local_50._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         vector_size(uVar1);
    local_48.data_ = (AssertHelperData *)0x0;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&local_40,"(size_t)vector_size(v)","(size_t)0",(unsigned_long *)&local_50
               ,(unsigned_long *)&local_48);
    puVar2 = local_38;
    if (local_40._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_50);
      if (local_38 == (undefined8 *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = (char *)*local_38;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_vector_test/source/adt_vector_test.cpp"
                 ,0x25,pcVar3);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
    }
    else {
      if (local_38 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_38 != local_38 + 2) {
          operator_delete((undefined8 *)*local_38);
        }
        operator_delete(puVar2);
      }
      local_40 = 0;
      do {
        vector_push_back(uVar1,&local_40);
        local_40 = local_40 + 1;
      } while (local_40 < 0x32);
      local_50._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           vector_size(uVar1);
      local_48.data_ = (AssertHelperData *)0x32;
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&local_40,"(size_t)vector_size(v)","(size_t)capacity",
                 (unsigned_long *)&local_50,(unsigned_long *)&local_48);
      puVar2 = local_38;
      if (local_40._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_50);
        if (local_38 == (undefined8 *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = (char *)*local_38;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_48,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_vector_test/source/adt_vector_test.cpp"
                   ,0x2c,pcVar3);
        testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
      }
      else {
        if (local_38 != (undefined8 *)0x0) {
          if ((undefined8 *)*local_38 != local_38 + 2) {
            operator_delete((undefined8 *)*local_38);
          }
          operator_delete(puVar2);
        }
        pAVar4 = (AssertHelperData *)0x0;
        while( true ) {
          puVar2 = (undefined8 *)vector_at(uVar1,pAVar4);
          local_50._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*puVar2;
          local_48.data_ = pAVar4;
          testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                    ((internal *)&local_40,"(size_t)current","(size_t)i",(unsigned_long *)&local_50,
                     (unsigned_long *)&local_48);
          puVar2 = local_38;
          if (local_40._0_1_ == (internal)0x0) break;
          if (local_38 != (undefined8 *)0x0) {
            if ((undefined8 *)*local_38 != local_38 + 2) {
              operator_delete((undefined8 *)*local_38);
            }
            operator_delete(puVar2);
          }
          pAVar4 = (AssertHelperData *)((long)&pAVar4->type + 1);
          if (pAVar4 == (AssertHelperData *)0x32) {
            vector_destroy(uVar1);
            return;
          }
        }
        testing::Message::Message((Message *)&local_50);
        if (local_38 == (undefined8 *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = (char *)*local_38;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_48,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_vector_test/source/adt_vector_test.cpp"
                   ,0x32,pcVar3);
        testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_48);
  if (local_50._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_50._M_head_impl + 8))();
  }
  if (local_38 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_38 != local_38 + 2) {
      operator_delete((undefined8 *)*local_38);
    }
    operator_delete(local_38);
  }
  return;
}

Assistant:

TEST_F(adt_vector_test, DefaultConstructor)
{
	static const size_t capacity = 50;

	vector v = vector_create_reserve_type(size_t, capacity);

	ASSERT_EQ((size_t)vector_type_size(v), (size_t)sizeof(size_t));
	ASSERT_EQ((size_t)vector_size(v), (size_t)0);

	for (size_t i = 0; i < capacity; ++i)
	{
		vector_push_back_var(v, i);
	}

	ASSERT_EQ((size_t)vector_size(v), (size_t)capacity);

	for (size_t i = 0; i < capacity; ++i)
	{
		size_t current = vector_at_type(v, i, size_t);

		ASSERT_EQ((size_t)current, (size_t)i);
	}

	vector_destroy(v);
}